

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVJobServerClient.cxx
# Opt level: O2

optional<cmUVJobServerClient> __thiscall
cmUVJobServerClient::Connect
          (cmUVJobServerClient *this,uv_loop_t *loop,function<void_()> *onToken,
          function<void_(int)> *onDisconnect)

{
  pointer pbVar1;
  size_type __pos;
  string_view str;
  string_view *psVar2;
  pointer pbVar3;
  bool bVar4;
  int iVar5;
  _Head_base<0UL,_cmUVJobServerClient::Impl_*,_false> this_00;
  pointer p_Var6;
  pointer pbVar7;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar8;
  string_view *psVar9;
  basic_string_view<char,_std::char_traits<char>_> str_00;
  optional<cmUVJobServerClient> oVar10;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l;
  string_view arg;
  int reader;
  __allocator_type __a2;
  uv_pipe_ptr connRead;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  makeflags;
  
  this_00._M_head_impl = (Impl *)operator_new(0xb8);
  Impl::Impl(this_00._M_head_impl,loop);
  (this_00._M_head_impl)->_vptr_Impl = (_func_int **)&PTR__ImplPosix_00a0bd18;
  *(undefined4 *)&this_00._M_head_impl[1]._vptr_Impl = 0;
  *(uv_loop_t **)((long)(this_00._M_head_impl + 1) + 8) = (uv_loop_t *)0x0;
  *(element_type **)
   &((uv_idle_ptr *)((long)(this_00._M_head_impl + 1) + 0x10))->super_uv_handle_ptr_<uv_idle_s> =
       (element_type *)0x0;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)(this_00._M_head_impl + 1) + 0x18) =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined8 *)
   &((function<void_()> *)((long)(this_00._M_head_impl + 1) + 0x20))->super__Function_base = 0;
  *(undefined8 *)((long)(this_00._M_head_impl + 1) + 0x28) = 0;
  *(_Manager_type *)((long)(this_00._M_head_impl + 1) + 0x30) = (_Manager_type)0x0;
  p_Var6 = std::
           allocator_traits<std::allocator<std::_Sp_counted_ptr_inplace<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
           ::allocate(&__a2,1);
  (p_Var6->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
  (p_Var6->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
  (p_Var6->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_00a0bda8;
  *(undefined8 *)((long)&(p_Var6->_M_impl)._M_storage._M_storage + 8) = 0;
  *(Impl **)&(p_Var6->_M_impl)._M_storage._M_storage = this_00._M_head_impl;
  *(code **)((long)&(p_Var6->_M_impl)._M_storage._M_storage + 0x18) =
       std::
       _Function_handler<void_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmUVJobServerClient.cxx:204:56)>
       ::_M_invoke;
  *(code **)((long)&(p_Var6->_M_impl)._M_storage._M_storage + 0x10) =
       std::
       _Function_handler<void_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmUVJobServerClient.cxx:204:56)>
       ::_M_manager;
  makeflags.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_string_length = 0;
  *(pointer *)
   &((function<void_(int)> *)((long)(this_00._M_head_impl + 1) + 0x40))->super__Function_base =
       p_Var6;
  *(_Impl **)((long)(this_00._M_head_impl + 1) + 0x38) = &p_Var6->_M_impl;
  makeflags.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)&__a2;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)&makeflags);
  *(undefined2 *)((long)(this_00._M_head_impl + 1) + 0x48) = 0x2e;
  if (((anonymous_namespace)::ImplPosix::Connect()::prefixes == '\0') &&
     (iVar5 = __cxa_guard_acquire(&(anonymous_namespace)::ImplPosix::Connect()::prefixes),
     iVar5 != 0)) {
    makeflags.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_engaged = true;
    makeflags.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._33_7_ = 0;
    makeflags.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._16_8_ = 0x10;
    makeflags.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._24_8_ = anon_var_dwarf_419123;
    makeflags.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)(pointer)0x11;
    makeflags.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._M_value._M_string_length = (size_type)anon_var_dwarf_41910d;
    __l._M_len = 3;
    __l._M_array = (iterator)&makeflags;
    std::
    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::vector((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              *)&(anonymous_namespace)::ImplPosix::Connect()::prefixes,__l,(allocator_type *)&__a2);
    __cxa_atexit(std::
                 vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 ::~vector,&(anonymous_namespace)::ImplPosix::Connect()::prefixes,&__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::ImplPosix::Connect()::prefixes);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&__a2,"MAKEFLAGS",(allocator<char> *)&connRead);
  cmSystemTools::GetEnvVar(&makeflags,(string *)&__a2);
  std::__cxx11::string::~string((string *)&__a2);
  if (makeflags.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged != false) {
    args.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    args.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    args.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmSystemTools::ParseUnixCommandLine
              ((char *)makeflags.
                       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                       ._M_payload.
                       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ._M_payload._M_value._M_dataplus._M_p,&args);
    pbVar3 = args.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar7 = args.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
LAB_00210286:
    psVar2 = DAT_00a311e0;
    if (pbVar7 != pbVar3) {
      pbVar1 = pbVar7 + -1;
      arg._M_str = pbVar7[-1]._M_dataplus._M_p;
      arg._M_len = pbVar7[-1]._M_string_length;
      psVar9 = (anonymous_namespace)::ImplPosix::Connect()::prefixes;
      do {
        pbVar7 = pbVar1;
        if (psVar9 == psVar2) goto LAB_00210286;
        __pos = psVar9->_M_len;
        str._M_str = arg._M_str;
        str._M_len = arg._M_len;
        bVar4 = cmHasPrefix(str,*psVar9);
        psVar9 = psVar9 + 1;
      } while (!bVar4);
      str_00 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                         (&arg,__pos,0xffffffffffffffff);
      cmTrimWhitespace_abi_cxx11_((string *)&connRead,str_00);
      std::optional<std::__cxx11::string>::operator=
                ((optional<std::__cxx11::string> *)&__a2,(string *)&connRead);
      std::__cxx11::string::~string((string *)&connRead);
      goto LAB_00210286;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&args);
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&__a2);
  }
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&makeflags);
  bVar4 = *(int *)&this_00._M_head_impl[1]._vptr_Impl == 0;
  if (bVar4) {
    (**(code **)((long)(this_00._M_head_impl)->_vptr_Impl + 8))(this_00._M_head_impl);
    uVar8 = extraout_RDX_00;
  }
  else {
    std::function<void_()>::operator=(&(this_00._M_head_impl)->OnToken,onToken);
    std::function<void_(int)>::operator=(&(this_00._M_head_impl)->OnDisconnect,onDisconnect);
    (this->Impl_)._M_t.
    super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
    ._M_t.
    super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
    .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>._M_head_impl = this_00._M_head_impl;
    uVar8 = extraout_RDX;
  }
  *(bool *)&this[1].Impl_._M_t.
            super___uniq_ptr_impl<cmUVJobServerClient::Impl,_std::default_delete<cmUVJobServerClient::Impl>_>
            ._M_t.
            super__Tuple_impl<0UL,_cmUVJobServerClient::Impl_*,_std::default_delete<cmUVJobServerClient::Impl>_>
            .super__Head_base<0UL,_cmUVJobServerClient::Impl_*,_false>._M_head_impl = !bVar4;
  oVar10.super__Optional_base<cmUVJobServerClient,_false,_false>._M_payload.
  super__Optional_payload<cmUVJobServerClient,_true,_false,_false>.
  super__Optional_payload_base<cmUVJobServerClient>._8_8_ = uVar8;
  oVar10.super__Optional_base<cmUVJobServerClient,_false,_false>._M_payload.
  super__Optional_payload<cmUVJobServerClient,_true,_false,_false>.
  super__Optional_payload_base<cmUVJobServerClient>._M_payload =
       (_Storage<cmUVJobServerClient,_false>)this;
  return (optional<cmUVJobServerClient>)
         oVar10.super__Optional_base<cmUVJobServerClient,_false,_false>._M_payload.
         super__Optional_payload<cmUVJobServerClient,_true,_false,_false>.
         super__Optional_payload_base<cmUVJobServerClient>;
}

Assistant:

cm::optional<cmUVJobServerClient> cmUVJobServerClient::Connect(
  uv_loop_t& loop, std::function<void()> onToken,
  std::function<void(int)> onDisconnect)
{
#if defined(_WIN32)
  // FIXME: Windows job server client not yet implemented.
  static_cast<void>(loop);
  static_cast<void>(onToken);
  static_cast<void>(onDisconnect);
#else
  auto impl = cm::make_unique<ImplPosix>(loop);
  if (impl && impl->IsConnected()) {
    impl->OnToken = std::move(onToken);
    impl->OnDisconnect = std::move(onDisconnect);
    return cmUVJobServerClient(std::move(impl));
  }
#endif
  return cm::nullopt;
}